

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O0

void __thiscall Mems::print_informations(Mems *this)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  pointer pMVar4;
  pointer pPVar5;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> local_30;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> local_28;
  iterator samp;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_18;
  iterator it;
  Mems *this_local;
  
  it._M_current = (Mirror *)this;
  poVar2 = std::operator<<((ostream *)&std::cout,"");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"MEMS-Informations");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"_mems_mirrors.size() = ");
  sVar3 = std::vector<Mirror,_std::allocator<Mirror>_>::size(&this->_mems_mirrors);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"_mems_mirrors_randomrasterized.size() = ");
  sVar3 = std::vector<Mirror,_std::allocator<Mirror>_>::size(&this->_mems_mirrors_randomrasterized);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"_mems_mirrors content: ");
  std::operator<<(poVar2,'\n');
  local_18._M_current =
       (Mirror *)std::begin<std::vector<Mirror,std::allocator<Mirror>>>(&this->_mems_mirrors_multi);
  while( true ) {
    samp._M_current =
         (Point_d *)std::end<std::vector<Mirror,std::allocator<Mirror>>>(&this->_mems_mirrors_multi)
    ;
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> *
                       )&samp);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"mirror id: ");
    pMVar4 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pMVar4->id);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"mirror pos: x ");
    pMVar4 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pMVar4->_position).x);
    poVar2 = std::operator<<(poVar2," ,   y ");
    pMVar4 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pMVar4->_position).y);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"displayed_sample pos: x ");
    pMVar4 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pMVar4->_displayed_sample).x);
    poVar2 = std::operator<<(poVar2," ,   y ");
    pMVar4 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pMVar4->_displayed_sample).y);
    poVar2 = std::operator<<(poVar2," ,   dist: ");
    pMVar4 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pMVar4->_displayed_sample).dis);
    std::operator<<(poVar2,'\n');
    std::operator<<((ostream *)&std::cout,'\n');
    pMVar4 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_18);
    local_28._M_current =
         (Point_d *)
         std::begin<std::vector<Point_d,std::allocator<Point_d>>>(&pMVar4->_matching_samples);
    while( true ) {
      pMVar4 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>
               ::operator->(&local_18);
      local_30._M_current =
           (Point_d *)
           std::begin<std::vector<Point_d,std::allocator<Point_d>>>(&pMVar4->_matching_samples);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      poVar2 = std::operator<<((ostream *)&std::cout," x ");
      pPVar5 = __gnu_cxx::
               __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
               operator->(&local_28);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pPVar5->x);
      poVar2 = std::operator<<(poVar2," ,   y ");
      pPVar5 = __gnu_cxx::
               __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
               operator->(&local_28);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pPVar5->y);
      std::operator<<(poVar2,'\n');
      __gnu_cxx::__normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
      operator++(&local_28);
    }
    __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
    operator++(&local_18);
  }
  return;
}

Assistant:

void Mems::print_informations(){
  std::cout << "" << '\n';
  std::cout << "MEMS-Informations" << '\n';
  std::cout << "" << '\n';
  std::cout << "_mems_mirrors.size() = "<< _mems_mirrors.size() << '\n';
  std::cout << "_mems_mirrors_randomrasterized.size() = "<< _mems_mirrors_randomrasterized.size() << '\n';
  std::cout << "" << '\n';
  std::cout << "_mems_mirrors content: " << '\n';
  for( auto it = std::begin(_mems_mirrors_multi); it!= std::end(_mems_mirrors_multi); ++it){
    std::cout <<"mirror id: " << it->id <<'\n';
    std::cout <<"mirror pos: x " << it->_position.x<<" ,   y " << it->_position.y<<'\n';
    std::cout <<"displayed_sample pos: x " << it->_displayed_sample.x<<" ,   y " << it->_displayed_sample.y<<" ,   dist: " << it->_displayed_sample.dis<<'\n';
//    std::cout <<"mirror amount of matching samples " << it->_ammount_of_matching_samples<<'\n';
    std::cout <<'\n';
    for(auto samp = std::begin(it->_matching_samples); samp != std::begin(it->_matching_samples); ++samp){
      std::cout <<" x " << samp->x<<" ,   y " << samp->y<<'\n';

    }
  }

}